

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  mpt_value *pmVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long lVar6;
  mpt_iterator *it;
  long local_40;
  double val;
  
  local_40 = (long)argc;
  lVar6 = 1;
  do {
    if (local_40 <= lVar6) {
      return 0;
    }
    plVar2 = (long *)mpt_iterator_create(argv[lVar6]);
    if (plVar2 == (long *)0x0) {
      puVar4 = (undefined8 *)&stderr;
      fputs("bad format <",_stderr);
      fputs(argv[lVar6],_stderr);
      fputc(0x3e,_stderr);
    }
    else {
      (**(code **)*plVar2)(plVar2,0x86,&it);
      do {
        pmVar3 = (*it->_vptr->value)(it);
        if (pmVar3 == (mpt_value *)0x0) {
          fprintf(_stderr,"%s\n","value query error");
          break;
        }
        iVar1 = mpt_value_convert(pmVar3,100,&val);
        if (iVar1 < 0) {
          pcVar5 = "conversion error";
LAB_001012eb:
          fprintf(_stderr,"%s: %d\n",pcVar5,(ulong)(uint)-iVar1);
          break;
        }
        fprintf(_stdout,"%g ",val);
        iVar1 = (*it->_vptr->advance)(it);
        if (iVar1 < 0) {
          pcVar5 = "advance error";
          goto LAB_001012eb;
        }
      } while (iVar1 != 0);
      (**(code **)(*plVar2 + 8))(plVar2);
      puVar4 = (undefined8 *)&stdout;
    }
    fputc(10,(FILE *)*puVar4);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

extern int main(int argc, char *argv[])
{
	int i;
	
	for (i = 1; i < argc; ++i) {
		MPT_INTERFACE(metatype) *src;
		MPT_INTERFACE(iterator) *it;
		if (!(src = mpt_iterator_create(argv[i]))) {
			fputs("bad format <", stderr);
			fputs(argv[i], stderr);
			fputc('>', stderr);
			fputc('\n', stderr);
			continue;
		}
		MPT_metatype_convert(src, MPT_ENUM(TypeIteratorPtr), &it);
		while (1) {
			const MPT_STRUCT(value) *src;
			double val;
			int res;
			if (!(src = it->_vptr->value(it))) {
				fprintf(stderr, "%s\n", "value query error");
				break;
			}
			if ((res = mpt_value_convert(src, 'd', &val)) < 0) {
				fprintf(stderr, "%s: %d\n", "conversion error", -res);
				break;
			}
			fprintf(stdout, "%g ", val);
			
			if ((res = it->_vptr->advance(it)) < 0) {
				fprintf(stderr, "%s: %d\n", "advance error", -res);
				break;
			}
			if (!res) {
				break;
			}
		}
		src->_vptr->unref(src);
		fputc('\n', stdout);
	}
	return 0;
}